

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void init_supported_formats
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                *formats)

{
  Converter *pCVar1;
  Converter *pCVar2;
  mapped_type *pmVar3;
  allocator local_31;
  Converter *local_30;
  key_type local_28;
  
  HawkTracer::parser::make_unique<HawkTracer::client::ChromeTraceConverter>();
  std::__cxx11::string::string((string *)&local_28,"chrome-tracing",&local_31);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
           ::operator[](formats,&local_28);
  pCVar2 = local_30;
  local_30 = (Converter *)0x0;
  pCVar1 = (pmVar3->_M_t).
           super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
           .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
  .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl = pCVar2;
  if (pCVar1 != (Converter *)0x0) {
    (*pCVar1->_vptr_Converter[1])();
  }
  std::__cxx11::string::~string((string *)&local_28);
  if (local_30 != (Converter *)0x0) {
    (*local_30->_vptr_Converter[1])();
  }
  HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>();
  std::__cxx11::string::string((string *)&local_28,"callgrind",&local_31);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
           ::operator[](formats,&local_28);
  pCVar2 = local_30;
  local_30 = (Converter *)0x0;
  pCVar1 = (pmVar3->_M_t).
           super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
           ._M_t.
           super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
           .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::Converter_*,_std::default_delete<HawkTracer::client::Converter>_>
  .super__Head_base<0UL,_HawkTracer::client::Converter_*,_false>._M_head_impl = pCVar2;
  if (pCVar1 != (Converter *)0x0) {
    (*pCVar1->_vptr_Converter[1])();
  }
  std::__cxx11::string::~string((string *)&local_28);
  if (local_30 != (Converter *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return;
}

Assistant:

void init_supported_formats(std::map<std::string, std::unique_ptr<client::Converter>>& formats)
{
    formats["chrome-tracing"] = parser::make_unique<client::ChromeTraceConverter>();
    formats["callgrind"] = parser::make_unique<client::CallgrindConverter>();
}